

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O0

uint json_get_anydata(lyd_node_anydata *any,char *data)

{
  uint uVar1;
  char *pcVar2;
  ushort **ppuVar3;
  char *str;
  uint c;
  uint stop;
  uint start;
  uint len;
  char *data_local;
  lyd_node_anydata *any_local;
  
  stop = 0;
  str._0_4_ = 0;
  _start = data;
  data_local = (char *)any;
  if ((*data == '\"') && (any->schema->nodetype == LYS_ANYXML)) {
    stop = 1;
    pcVar2 = lyjson_parse_text(data + 1,(uint *)&str);
    if (pcVar2 == (char *)0x0) {
      any_local._4_4_ = 0;
    }
    else if (_start[stop + (int)str] == '\"') {
      pcVar2 = lydict_insert_zc((ly_ctx *)**(undefined8 **)(*(long *)data_local + 0x30),pcVar2);
      *(char **)(data_local + 0x38) = pcVar2;
      data_local[0x30] = '\0';
      data_local[0x31] = '\0';
      data_local[0x32] = '\0';
      data_local[0x33] = '\0';
      any_local._4_4_ = stop + (int)str + 1;
    }
    else {
      free(pcVar2);
      ly_vlog(LYE_XML_INVAL,LY_VLOG_LYD,data_local,
              "JSON data (missing quotation-mark at the end of string)");
      any_local._4_4_ = 0;
    }
  }
  else if (*data == '{') {
    stop = 1;
    str._0_4_ = 1;
    uVar1 = skip_ws(data + 1);
    c = uVar1 + stop;
    str._4_4_ = c - 1;
    stop = c;
    while (_start[stop] != '\0' && (int)str != 0) {
      if (_start[stop] == '{') {
        str._0_4_ = (int)str + 1;
      }
      else if (_start[stop] == '}') {
        str._0_4_ = (int)str + -1;
      }
      else {
        ppuVar3 = __ctype_b_loc();
        if (((*ppuVar3)[(int)_start[stop]] & 0x2000) == 0) {
          str._4_4_ = stop;
        }
      }
      stop = stop + 1;
    }
    if ((int)str == 0) {
      data_local[0x30] = '\x02';
      data_local[0x31] = '\0';
      data_local[0x32] = '\0';
      data_local[0x33] = '\0';
      if (c <= str._4_4_) {
        pcVar2 = lydict_insert((ly_ctx *)**(undefined8 **)(*(long *)data_local + 0x30),_start + c,
                               (ulong)((str._4_4_ - c) + 1));
        *(char **)(data_local + 0x38) = pcVar2;
      }
      any_local._4_4_ = stop;
    }
    else {
      ly_vlog(LYE_EOF,LY_VLOG_LYD,data_local);
      any_local._4_4_ = 0;
    }
  }
  else {
    ly_vlog(LYE_XML_INVAL,LY_VLOG_LYD,any,
            "Unsupported Anydata/anyxml content (not an object nor string)");
    any_local._4_4_ = 0;
  }
  return any_local._4_4_;
}

Assistant:

static unsigned int
json_get_anydata(struct lyd_node_anydata *any, const char *data)
{
    unsigned int len = 0, start, stop, c = 0;
    char *str;

    /* anydata (as well as meaningful anyxml) is supposed to be encoded as object,
     * anyxml can be a string value, other JSON types are not supported since it is
     * not clear how they are supposed to be represented/converted into an internal representation */
    if (data[len] == '"' && any->schema->nodetype == LYS_ANYXML) {
        len = 1;
        str = lyjson_parse_text(&data[len], &c);
        if (!str) {
            return 0;
        }
        if (data[len + c] != '"') {
            free(str);
            LOGVAL(LYE_XML_INVAL, LY_VLOG_LYD, any,
                   "JSON data (missing quotation-mark at the end of string)");
            return 0;
        }

        any->value.str = lydict_insert_zc(any->schema->module->ctx, str);
        any->value_type = LYD_ANYDATA_CONSTSTRING;
        return len + c + 1;
    } else if (data[len] != '{') {
        LOGVAL(LYE_XML_INVAL, LY_VLOG_LYD, any, "Unsupported Anydata/anyxml content (not an object nor string)");
        return 0;
    }

    /* count opening '{' and closing '}' brackets to get the end of the object without its parsing */
    c = len = 1;
    len += skip_ws(&data[len]);
    start = len;
    stop = start - 1;
    while (data[len] && c) {
        switch (data[len]) {
        case '{':
            c++;
            break;
        case '}':
            c--;
            break;
        default:
            if (!isspace(data[len])) {
                stop = len;
            }
        }
        len++;
    }
    if (c) {
        LOGVAL(LYE_EOF, LY_VLOG_LYD, any);
        return 0;
    }
    any->value_type = LYD_ANYDATA_JSON;
    if (stop >= start) {
        any->value.str = lydict_insert(any->schema->module->ctx, &data[start], stop - start + 1);
    } /* else no data */

    return len;
}